

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *in_R9;
  AssertionHelper local_480;
  Fixed local_450;
  int local_2c8;
  char local_2c4 [4];
  undefined1 local_2c0 [8];
  AssertionResult iutest_ar_1;
  string local_290;
  AssertionHelper local_270;
  Fixed local_240;
  bool local_a2;
  ExpressionDecomposer local_a1;
  ExpressionLHS<bool> local_a0;
  AssertionResult local_78;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  wchar_t negative;
  iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test *this_local;
  
  iutest_ar.m_result = true;
  iutest_ar._33_7_ = 0x61000000;
  iutest::detail::AlwaysZero();
  local_a2 = false;
  iutest::detail::ExpressionDecomposer::operator->*(&local_a0,&local_a1,&local_a2);
  iutest::detail::ExpressionLHS<bool>::GetResult(&local_78,&local_a0,true);
  iutest::AssertionResult::Is((AssertionResult *)local_50,&local_78);
  iutest::AssertionResult::~AssertionResult(&local_78);
  iutest::detail::ExpressionLHS<bool>::~ExpressionLHS(&local_a0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_240,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_240);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_290,(internal *)local_50,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value))))"
               ,"false","true",(char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x62,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_270,&local_240);
    iutest::AssertionHelper::~AssertionHelper(&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    iutest::AssertionHelper::Fixed::~Fixed(&local_240);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_2c4[0] = '\0';
    local_2c4[1] = '\0';
    local_2c4[2] = '\0';
    local_2c4[3] = '\0';
    local_2c8 = iutest::detail::wrapper::iu_wcsicmp(L"AAA",(wchar_t *)&iutest_ar.m_result);
    iutest::internal::CmpHelperGT<int,int>
              ((AssertionResult *)local_2c0,(internal *)0x1c9d22,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", negative_sample)",local_2c4,
               &local_2c8,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar1) {
      memset(&local_450,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_450);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2c0);
      iutest::AssertionHelper::AssertionHelper
                (&local_480,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
                 ,99,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_480,&local_450);
      iutest::AssertionHelper::~AssertionHelper(&local_480);
      iutest::AssertionHelper::Fixed::~Fixed(&local_450);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmpNegativeGT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", negative_sample));
}